

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_utils.c
# Opt level: O2

_Bool utf8_reverse(char *p)

{
  ushort *puVar1;
  byte bVar2;
  byte bVar3;
  byte *pbVar4;
  byte *pbVar5;
  long lVar6;
  uint uVar7;
  
  string_reverse(p);
  for (pbVar5 = (byte *)p;
      (pbVar4 = (byte *)0x0, pbVar5 != (byte *)0x0 && (pbVar4 = pbVar5, *pbVar5 != 0));
      pbVar5 = pbVar5 + 1) {
  }
  while( true ) {
    pbVar5 = pbVar4;
    pbVar4 = pbVar5 + -1;
    lVar6 = (long)pbVar4 - (long)p;
    if (pbVar4 <= p) break;
    bVar2 = *pbVar4;
    uVar7 = (uint)(bVar2 >> 4);
    if (uVar7 - 0xc < 2) {
      if (lVar6 < 1) break;
      bVar3 = pbVar5[-2];
      pbVar5[-2] = bVar2;
      pbVar5[-1] = bVar3;
      pbVar4 = pbVar5 + -2;
    }
    else if (uVar7 == 0xe) {
      if (lVar6 < 3) break;
      bVar3 = pbVar5[-3];
      pbVar5[-3] = bVar2;
      pbVar5[-1] = bVar3;
      pbVar4 = pbVar5 + -3;
    }
    else if (uVar7 == 0xf) {
      if (lVar6 < 4) break;
      bVar3 = pbVar5[-4];
      pbVar5[-4] = bVar2;
      pbVar5[-1] = bVar3;
      puVar1 = (ushort *)(pbVar5 + -3);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      pbVar4 = pbVar5 + -4;
    }
  }
  return pbVar4 <= p;
}

Assistant:

bool utf8_reverse (char *p) {
    char *q = p;
    string_reverse(p);
    
    // now fix bass-ackwards UTF chars.
    while(q && *q) ++q; // find eos
    while(p < --q)
        switch( (*q & 0xF0) >> 4 ) {
            case 0xF: /* U+010000-U+10FFFF: four bytes. */
                if (q-p < 4) return false;
                SWP(*(q-0), *(q-3));
                SWP(*(q-1), *(q-2));
                q -= 3;
                break;
            case 0xE: /* U+000800-U+00FFFF: three bytes. */
                if (q-p < 3) return false;
                SWP(*(q-0), *(q-2));
                q -= 2;
                break;
            case 0xC: /* fall-through */
            case 0xD: /* U+000080-U+0007FF: two bytes. */
                if (q-p < 1) return false;
                SWP(*(q-0), *(q-1));
                q--;
                break;
        }
    return true;
}